

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void iadst4_w4_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int local_68 [8];
  __m128i x2 [4];
  
  alVar1 = *input;
  alVar2 = input[1];
  auVar6._0_12_ = alVar1._0_12_;
  auVar6._12_2_ = alVar1[0]._6_2_;
  auVar6._14_2_ = *(undefined2 *)((long)input[2] + 6);
  auVar20._12_4_ = auVar6._12_4_;
  auVar20._0_10_ = alVar1._0_10_;
  auVar20._10_2_ = *(undefined2 *)((long)input[2] + 4);
  auVar16._10_6_ = auVar20._10_6_;
  auVar16._0_8_ = alVar1[0];
  auVar16._8_2_ = alVar1[0]._4_2_;
  auVar18._8_8_ = auVar16._8_8_;
  auVar18._6_2_ = *(undefined2 *)((long)input[2] + 2);
  auVar18._4_2_ = alVar1[0]._2_2_;
  auVar18._0_2_ = (undefined2)alVar1[0];
  auVar18._2_2_ = (short)input[2][0];
  auVar14._0_12_ = alVar2._0_12_;
  auVar14._12_2_ = alVar2[0]._6_2_;
  auVar14._14_2_ = *(undefined2 *)((long)input[3] + 6);
  auVar12._12_4_ = auVar14._12_4_;
  auVar12._0_10_ = alVar2._0_10_;
  auVar12._10_2_ = *(undefined2 *)((long)input[3] + 4);
  auVar10._10_6_ = auVar12._10_6_;
  auVar10._0_8_ = alVar2[0];
  auVar10._8_2_ = alVar2[0]._4_2_;
  auVar8._8_8_ = auVar10._8_8_;
  auVar8._6_2_ = *(undefined2 *)((long)input[3] + 2);
  auVar8._4_2_ = alVar2[0]._2_2_;
  auVar8._0_2_ = (undefined2)alVar2[0];
  auVar8._2_2_ = (short)input[3][0];
  auVar9._8_4_ = 0xedb0529;
  auVar9._0_8_ = 0xedb05290edb0529;
  auVar9._12_4_ = 0xedb0529;
  auVar10 = pmaddwd(auVar9,auVar18);
  auVar13._8_4_ = 0xfad709b2;
  auVar13._0_8_ = 0xfad709b2fad709b2;
  auVar13._12_4_ = 0xfad709b2;
  auVar14 = pmaddwd(auVar13,auVar18);
  auVar19._8_4_ = 0x9b20d10;
  auVar19._0_8_ = 0x9b20d1009b20d10;
  auVar19._12_4_ = 0x9b20d10;
  auVar20 = pmaddwd(auVar19,auVar8);
  auVar11._8_4_ = 0xf1250d10;
  auVar11._0_8_ = 0xf1250d10f1250d10;
  auVar11._12_4_ = 0xf1250d10;
  auVar12 = pmaddwd(auVar11,auVar8);
  auVar15._8_4_ = 0xf2f00d10;
  auVar15._0_8_ = 0xf2f00d10f2f00d10;
  auVar15._12_4_ = 0xf2f00d10;
  auVar16 = pmaddwd(auVar15,auVar18);
  auVar4._8_4_ = 0xd100000;
  auVar4._0_8_ = 0xd1000000d100000;
  auVar4._12_4_ = 0xd100000;
  auVar4 = pmaddwd(auVar4,auVar8);
  auVar17._8_4_ = 0x9b20edb;
  auVar17._0_8_ = 0x9b20edb09b20edb;
  auVar17._12_4_ = 0x9b20edb;
  auVar18 = pmaddwd(auVar17,auVar18);
  auVar7._8_4_ = 0xfad7f2f0;
  auVar7._0_8_ = 0xfad7f2f0fad7f2f0;
  auVar7._12_4_ = 0xfad7f2f0;
  auVar8 = pmaddwd(auVar7,auVar8);
  local_68[0] = auVar20._0_4_ + auVar10._0_4_;
  local_68[1] = auVar20._4_4_ + auVar10._4_4_;
  local_68[2] = auVar20._8_4_ + auVar10._8_4_;
  local_68[3] = auVar20._12_4_ + auVar10._12_4_;
  local_68[4] = auVar12._0_4_ + auVar14._0_4_;
  local_68[5] = auVar12._4_4_ + auVar14._4_4_;
  local_68[6] = auVar12._8_4_ + auVar14._8_4_;
  local_68[7] = auVar12._12_4_ + auVar14._12_4_;
  x2[0][0]._0_4_ = auVar4._0_4_ + auVar16._0_4_;
  x2[0][0]._4_4_ = auVar4._4_4_ + auVar16._4_4_;
  x2[0][1]._0_4_ = auVar4._8_4_ + auVar16._8_4_;
  x2[0][1]._4_4_ = auVar4._12_4_ + auVar16._12_4_;
  x2[1][0]._0_4_ = auVar8._0_4_ + auVar18._0_4_;
  x2[1][0]._4_4_ = auVar8._4_4_ + auVar18._4_4_;
  x2[1][1]._0_4_ = auVar8._8_4_ + auVar18._8_4_;
  x2[1][1]._4_4_ = auVar8._12_4_ + auVar18._12_4_;
  lVar3 = 0;
  do {
    auVar5._0_4_ = *(int *)((long)local_68 + lVar3) + 0x800 >> 0xc;
    auVar5._4_4_ = *(int *)((long)local_68 + lVar3 + 4) + 0x800 >> 0xc;
    auVar5._8_4_ = *(int *)((long)local_68 + lVar3 + 8) + 0x800 >> 0xc;
    auVar5._12_4_ = *(int *)((long)local_68 + lVar3 + 0xc) + 0x800 >> 0xc;
    auVar4 = packssdw(auVar5,auVar5);
    *(undefined1 (*) [16])((long)*output + lVar3) = auVar4;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  return;
}

Assistant:

static void iadst4_w4_sse2(const __m128i *input, __m128i *output) {
  const int32_t *sinpi = sinpi_arr(INV_COS_BIT);
  const __m128i sinpi_p01_p04 = pair_set_epi16(sinpi[1], sinpi[4]);
  const __m128i sinpi_p02_m01 = pair_set_epi16(sinpi[2], -sinpi[1]);
  const __m128i sinpi_p03_p02 = pair_set_epi16(sinpi[3], sinpi[2]);
  const __m128i sinpi_p03_m04 = pair_set_epi16(sinpi[3], -sinpi[4]);
  const __m128i sinpi_p03_m03 = pair_set_epi16(sinpi[3], -sinpi[3]);
  const __m128i sinpi_0_p03 = pair_set_epi16(0, sinpi[3]);
  const __m128i sinpi_p04_p02 = pair_set_epi16(sinpi[4], sinpi[2]);
  const __m128i sinpi_m03_m01 = pair_set_epi16(-sinpi[3], -sinpi[1]);
  __m128i x0[4];
  x0[0] = input[0];
  x0[1] = input[1];
  x0[2] = input[2];
  x0[3] = input[3];

  __m128i u[2];
  u[0] = _mm_unpacklo_epi16(x0[0], x0[2]);
  u[1] = _mm_unpacklo_epi16(x0[1], x0[3]);

  __m128i x1[8];
  x1[0] = _mm_madd_epi16(u[0], sinpi_p01_p04);  // x0*sin1 + x2*sin4
  x1[1] = _mm_madd_epi16(u[0], sinpi_p02_m01);  // x0*sin2 - x2*sin1
  x1[2] = _mm_madd_epi16(u[1], sinpi_p03_p02);  // x1*sin3 + x3*sin2
  x1[3] = _mm_madd_epi16(u[1], sinpi_p03_m04);  // x1*sin3 - x3*sin4
  x1[4] = _mm_madd_epi16(u[0], sinpi_p03_m03);  // x0*sin3 - x2*sin3
  x1[5] = _mm_madd_epi16(u[1], sinpi_0_p03);    // x2*sin3
  x1[6] = _mm_madd_epi16(u[0], sinpi_p04_p02);  // x0*sin4 + x2*sin2
  x1[7] = _mm_madd_epi16(u[1], sinpi_m03_m01);  // -x1*sin3 - x3*sin1

  __m128i x2[4];
  x2[0] = _mm_add_epi32(x1[0], x1[2]);  // x0*sin1 + x2*sin4 + x1*sin3 + x3*sin2
  x2[1] = _mm_add_epi32(x1[1], x1[3]);  // x0*sin2 - x2*sin1 + x1*sin3 - x3*sin4
  x2[2] = _mm_add_epi32(x1[4], x1[5]);  // x0*sin3 - x2*sin3 + x3*sin3
  x2[3] = _mm_add_epi32(x1[6], x1[7]);  // x0*sin4 + x2*sin2 - x1*sin3 - x3*sin1

  const __m128i rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  for (int i = 0; i < 4; ++i) {
    __m128i out0 = _mm_add_epi32(x2[i], rounding);
    out0 = _mm_srai_epi32(out0, INV_COS_BIT);
    output[i] = _mm_packs_epi32(out0, out0);
  }
}